

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O0

void __thiscall
viennamath::rt_interval<viennamath::rt_expression_interface<double>_>::rt_interval
          (rt_interval<viennamath::rt_expression_interface<double>_> *this)

{
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *prVar1;
  rt_interval<viennamath::rt_expression_interface<double>_> *this_local;
  
  prVar1 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar1,0.0);
  rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&this->lower_,(rt_expression_interface<double> *)prVar1);
  prVar1 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(prVar1,1.0);
  rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&this->upper_,(rt_expression_interface<double> *)prVar1);
  return;
}

Assistant:

explicit rt_interval() : lower_(new rt_constant<numeric_type, InterfaceType>(0)),
                               upper_(new rt_constant<numeric_type, InterfaceType>(1)) {}